

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O0

ValueArray<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>
* testing::
  Values<std::tuple<int,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>,std::tuple<long,int>>
            (tuple<int,_int> *v,tuple<long,_int> *v_1,tuple<long,_int> *v_2,tuple<long,_int> *v_3,
            tuple<long,_int> *v_4,tuple<long,_int> *v_5,tuple<long,_int> *v_6,tuple<long,_int> *v_7,
            tuple<long,_int> *v_8,tuple<long,_int> *v_9,tuple<long,_int> *v_10,
            tuple<long,_int> *v_11,tuple<long,_int> *v_12,tuple<long,_int> *v_13,
            tuple<long,_int> *v_14,tuple<long,_int> *v_15,tuple<long,_int> *v_16,
            tuple<long,_int> *v_17,tuple<long,_int> *v_18,tuple<long,_int> *v_19,
            tuple<long,_int> *v_20,tuple<long,_int> *v_21,tuple<long,_int> *v_22,
            tuple<long,_int> *v_23,tuple<long,_int> *v_24,tuple<long,_int> *v_25,
            tuple<long,_int> *v_26,tuple<long,_int> *v_27,tuple<long,_int> *v_28,
            tuple<long,_int> *v_29,tuple<long,_int> *v_30,tuple<long,_int> *v_31,
            tuple<long,_int> *v_32,tuple<long,_int> *v_33,tuple<long,_int> *v_34,
            tuple<long,_int> *v_35,tuple<long,_int> *v_36,tuple<long,_int> *v_37,
            tuple<long,_int> *v_38,tuple<long,_int> *v_39,tuple<long,_int> *v_40,
            tuple<long,_int> *v_41,tuple<long,_int> *v_42,tuple<long,_int> *v_43,
            tuple<long,_int> *v_44,tuple<long,_int> *v_45,tuple<long,_int> *v_46,
            tuple<long,_int> *v_47,tuple<long,_int> *v_48,tuple<long,_int> *v_49)

{
  ValueArray<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>
  *in_RDI;
  tuple<long,_int> *in_stack_00000108;
  tuple<long,_int> *in_stack_00000110;
  tuple<long,_int> *in_stack_00000118;
  tuple<long,_int> *in_stack_00000120;
  tuple<int,_int> *in_stack_00000128;
  ValueArray<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>
  *in_stack_00000130;
  tuple<long,_int> *in_stack_fffffffffffff858;
  tuple<long,_int> *in_stack_fffffffffffff860;
  ValueArray<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>
  *this;
  ValueArray<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>
  *v_43_00;
  tuple<long,_int> *in_stack_fffffffffffffc88;
  _Head_base<0UL,_long,_false> in_stack_fffffffffffffc90;
  tuple<long,_int> *in_stack_fffffffffffffc98;
  tuple<long,_int> *in_stack_fffffffffffffca0;
  tuple<long,_int> *in_stack_fffffffffffffca8;
  tuple<long,_int> *in_stack_fffffffffffffcb0;
  tuple<long,_int> local_2e8;
  tuple<long,_int> local_2d8;
  tuple<long,_int> local_2c8;
  tuple<long,_int> local_2b8;
  tuple<long,_int> local_2a8;
  tuple<long,_int> local_298;
  tuple<long,_int> local_288;
  tuple<long,_int> local_278;
  tuple<long,_int> local_268;
  tuple<long,_int> local_258;
  tuple<long,_int> local_248;
  tuple<long,_int> local_238;
  tuple<long,_int> local_228;
  tuple<long,_int> local_218;
  tuple<long,_int> local_208;
  tuple<long,_int> local_1f8;
  tuple<long,_int> local_1e8;
  tuple<long,_int> local_1d8;
  tuple<long,_int> local_1c8;
  tuple<long,_int> local_1b8;
  tuple<long,_int> local_1a8;
  tuple<long,_int> local_198;
  tuple<long,_int> local_188;
  tuple<long,_int> local_178;
  tuple<long,_int> local_168;
  tuple<long,_int> local_158;
  tuple<long,_int> local_148;
  tuple<long,_int> local_138;
  tuple<long,_int> local_128;
  tuple<long,_int> local_118;
  tuple<long,_int> local_108;
  tuple<long,_int> local_f8;
  tuple<long,_int> local_e8;
  tuple<long,_int> local_d8;
  tuple<long,_int> local_c8;
  tuple<long,_int> local_b8 [8];
  
  v_43_00 = in_RDI;
  std::tuple<int,_int>::tuple
            ((tuple<int,_int> *)in_stack_fffffffffffff860,
             (tuple<int,_int> *)in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  this = in_stack_00000130;
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::tuple<long,_int>::tuple(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  internal::
  ValueArray<std::tuple<int,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>,_std::tuple<long,_int>_>
  ::ValueArray(this,in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
               in_stack_00000108,(tuple<long,_int> *)in_RDI,local_b8,&local_c8,&local_d8,&local_e8,
               &local_f8,&local_108,&local_118,&local_128,&local_138,&local_148,&local_158,
               &local_168,&local_178,&local_188,&local_198,&local_1a8,&local_1b8,&local_1c8,
               &local_1d8,&local_1e8,&local_1f8,&local_208,&local_218,&local_228,&local_238,
               &local_248,&local_258,&local_268,&local_278,&local_288,&local_298,&local_2a8,
               &local_2b8,&local_2c8,&local_2d8,&local_2e8,
               (tuple<long,_int> *)&stack0xfffffffffffffc88,(tuple<long,_int> *)v_43_00,
               in_stack_fffffffffffffc88,(tuple<long,_int> *)in_stack_fffffffffffffc90._M_head_impl,
               in_stack_fffffffffffffc98,in_stack_fffffffffffffca0,in_stack_fffffffffffffca8,
               in_stack_fffffffffffffcb0);
  return v_43_00;
}

Assistant:

internal::ValueArray<T...> Values(T... v) {
  return internal::ValueArray<T...>(std::move(v)...);
}